

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O0

int fy_document_vdiag(fy_document *fyd,uint flags,char *file,int line,char *func,char *fmt,
                     __va_list_tag *ap)

{
  fy_parse_cfg_flags fVar1;
  uint uVar2;
  int rc;
  uint fyd_module_mask;
  int fydc_module;
  int fyd_level;
  int fydc_level;
  uint pflags;
  fy_diag_ctx fydc;
  char *fmt_local;
  char *func_local;
  int line_local;
  char *file_local;
  uint flags_local;
  fy_document *fyd_local;
  
  if (((fyd == (fy_document *)0x0) || (fmt == (char *)0x0)) || (fyd->diag == (fy_diag *)0x0)) {
    fyd_local._4_4_ = -1;
  }
  else {
    fydc._40_8_ = fmt;
    fVar1 = fy_document_get_cfg_flags(fyd);
    fydc_level = flags & 0xf;
    if ((uint)fydc_level < (fVar1 >> 0xc & 0xf)) {
      fyd_local._4_4_ = 0;
    }
    else {
      uVar2 = (flags & 0xf0) >> 4;
      if ((fVar1 >> 4 & 0xff & 1 << (sbyte)uVar2) == 0) {
        fyd_local._4_4_ = 0;
      }
      else {
        memset(&fydc_level,0,0x30);
        fydc.file._0_4_ = 0xffffffff;
        fydc.file._4_4_ = 0xffffffff;
        pflags = uVar2;
        fydc._0_8_ = func;
        fydc.source_func = file;
        fydc.source_file._0_4_ = line;
        fyd_local._4_4_ = fy_vdiag(fyd->diag,(fy_diag_ctx *)&fydc_level,(char *)fydc._40_8_,ap);
      }
    }
  }
  return fyd_local._4_4_;
}

Assistant:

int fy_document_vdiag(struct fy_document *fyd, unsigned int flags,
                      const char *file, int line, const char *func,
                      const char *fmt, va_list ap) {
    struct fy_diag_ctx fydc;
    unsigned int pflags;
    int fydc_level, fyd_level, fydc_module;
    unsigned int fyd_module_mask;
    int rc;

    if (!fyd || !fmt || !fyd->diag)
        return -1;

    pflags = fy_document_get_cfg_flags(fyd);

    /* perform the enable tests early to avoid the overhead */
    fydc_level = (flags & FYDF_LEVEL_MASK) >> FYDF_LEVEL_SHIFT;
    fyd_level = (pflags >> FYPCF_DEBUG_LEVEL_SHIFT) & FYPCF_DEBUG_LEVEL_MASK;

    if (fydc_level < fyd_level)
        return 0;

    fydc_module = (flags & FYDF_MODULE_MASK) >> FYDF_MODULE_SHIFT;
    fyd_module_mask = (pflags >> FYPCF_MODULE_SHIFT) & FYPCF_MODULE_MASK;

    if (!(fyd_module_mask & FY_BIT(fydc_module)))
        return 0;

    /* fill in fy_diag_ctx */
    memset(&fydc, 0, sizeof(fydc));

    fydc.level = fydc_level;
    fydc.module = fydc_module;
    fydc.source_file = file;
    fydc.source_line = line;
    fydc.source_func = func;
    fydc.line = -1;
    fydc.column = -1;

    rc = fy_vdiag(fyd->diag, &fydc, fmt, ap);

    return rc;
}